

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetItem
               (CodedInputStream *input,Message *message)

{
  byte *pbVar1;
  bool bVar2;
  uint32_t first_byte_or_zero;
  int iVar3;
  uint8_t *buffer;
  Metadata MVar4;
  uint32_t local_b8;
  uint32_t type_id;
  string message_data;
  CodedInputStream local_90;
  Reflection *local_40;
  Message *local_38;
  
  MVar4 = Message::GetMetadata(message);
  local_40 = MVar4.reflection;
  message_data._M_dataplus._M_p = (pointer)&message_data.field_2;
  message_data._M_string_length = 0;
  message_data.field_2._M_local_buf[0] = '\0';
  iVar3 = 0;
  local_b8 = 0;
  local_38 = message;
LAB_0022cef1:
  do {
    pbVar1 = input->buffer_;
    if (pbVar1 < input->buffer_end_) {
      first_byte_or_zero = (uint32_t)*pbVar1;
      if ((char)*pbVar1 < '\0') goto LAB_0022cf0b;
      input->buffer_ = pbVar1 + 1;
    }
    else {
      first_byte_or_zero = 0;
LAB_0022cf0b:
      first_byte_or_zero = io::CodedInputStream::ReadTagFallback(input,first_byte_or_zero);
    }
    if (first_byte_or_zero == 0x1a) {
      if (iVar3 == 0) {
        bVar2 = io::CodedInputStream::ReadVarint32(input,(uint32_t *)&local_90);
        if ((!bVar2) || ((int)(uint)local_90.buffer_ < 0)) goto LAB_0022d0b4;
        iVar3 = 0x1f;
        if (((uint)local_90.buffer_ | 1) != 0) {
          for (; ((uint)local_90.buffer_ | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        std::__cxx11::string::resize((ulong)&message_data);
        buffer = io::CodedOutputStream::WriteVarint32ToArray
                           ((uint)local_90.buffer_,(uint8_t *)message_data._M_dataplus._M_p);
        bVar2 = io::CodedInputStream::ReadRaw(input,buffer,(uint)local_90.buffer_);
        iVar3 = 2;
      }
      else if (iVar3 == 1) {
        bVar2 = ParseAndMergeMessageSetItem(google::protobuf::io::CodedInputStream*,google::protobuf
                ::Message*)::MSReflective::ParseField(int,google::protobuf::io::CodedInputStream__
                          (&local_40,local_b8,input);
        iVar3 = 3;
      }
      else {
        bVar2 = SkipField(input,0x1a,(UnknownFieldSet *)0x0);
      }
    }
    else {
      if (first_byte_or_zero == 0) goto LAB_0022d0b4;
      if (first_byte_or_zero == 0xc) {
        bVar2 = true;
        goto LAB_0022d0ba;
      }
      if (first_byte_or_zero == 0x10) {
        bVar2 = io::CodedInputStream::ReadVarint32(input,&type_id);
        if (!bVar2 || type_id == 0) goto LAB_0022d0b4;
        if (iVar3 == 2) {
          local_90.buffer_ = (uint8_t *)message_data._M_dataplus._M_p;
          local_90.total_bytes_read_ = (int)message_data._M_string_length;
          local_90.buffer_end_ =
               (uint8_t *)(message_data._M_dataplus._M_p + local_90.total_bytes_read_);
          local_90.input_ = (ZeroCopyInputStream *)0x0;
          local_90._28_7_ = 0;
          local_90._35_4_ = 0;
          local_90.buffer_size_after_limit_ = 0;
          local_90.total_bytes_limit_ = 0x7fffffff;
          local_90.extension_pool_ = (DescriptorPool *)0x0;
          local_90.extension_factory_ = (MessageFactory *)0x0;
          local_90.recursion_budget_ = input->recursion_budget_;
          local_90.current_limit_ = local_90.total_bytes_read_;
          local_90.recursion_limit_ = local_90.recursion_budget_;
          bVar2 = ParseAndMergeMessageSetItem(google::protobuf::io::CodedInputStream*,google::
                  protobuf::Message*)::MSReflective::ParseField(int,google::protobuf::io::
                  CodedInputStream__(&local_40,type_id,&local_90);
          iVar3 = 2;
          if (bVar2) {
            message_data._M_string_length = 0;
            *message_data._M_dataplus._M_p = '\0';
            iVar3 = 3;
          }
          io::CodedInputStream::~CodedInputStream(&local_90);
          if (!bVar2) goto LAB_0022d0b4;
        }
        else if (iVar3 == 0) {
          iVar3 = 1;
          local_b8 = type_id;
        }
        goto LAB_0022cef1;
      }
      bVar2 = SkipField(input,first_byte_or_zero,(UnknownFieldSet *)0x0);
    }
    if (bVar2 == false) {
LAB_0022d0b4:
      bVar2 = false;
LAB_0022d0ba:
      std::__cxx11::string::~string((string *)&message_data);
      return bVar2;
    }
  } while( true );
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetItem(io::CodedInputStream* input,
                                             Message* message) {
  struct MSReflective {
    bool ParseField(int type_id, io::CodedInputStream* input) {
      const FieldDescriptor* field =
          message_reflection->FindKnownExtensionByNumber(type_id);
      return ParseAndMergeMessageSetField(type_id, field, message, input);
    }

    bool SkipField(uint32_t tag, io::CodedInputStream* input) {
      return WireFormat::SkipField(input, tag, nullptr);
    }

    const Reflection* message_reflection;
    Message* message;
  };

  return ParseMessageSetItemImpl(
      input, MSReflective{message->GetReflection(), message});
}